

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O2

Matrix3x3 * CGL::operator*(Matrix3x3 *__return_storage_ptr__,double c,Matrix3x3 *A)

{
  int i;
  long lVar1;
  
  Matrix3x3::Matrix3x3(__return_storage_ptr__);
  for (lVar1 = 0; lVar1 != 9; lVar1 = lVar1 + 1) {
    (&__return_storage_ptr__->entries[0].x)[lVar1] = (&A->entries[0].x)[lVar1] * c;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 operator*( double c, const Matrix3x3& A ) {

    Matrix3x3 cA;
    const double* Aij = (const double*) &A;
    double* cAij = (double*) &cA;

    for (int i = 0; i < 9; ++i)
      cAij[i] = c * Aij[i];

    return cA;
  }